

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O3

bool __thiscall Rml::DataViewAttributeIf::Update(DataViewAttributeIf *this,DataModel *model)

{
  code *pcVar1;
  byte bVar2;
  bool bVar3;
  Element *element;
  Variant *pVVar4;
  String *name;
  byte bVar5;
  DataExpression *this_00;
  Variant variant;
  DataExpressionInterface expr_interface;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  Variant local_60;
  DataExpressionInterface local_38;
  
  Variant::Variant(&local_60);
  element = DataView::GetElement((DataView *)this);
  DataExpressionInterface::DataExpressionInterface(&local_38,model,element,(Event *)0x0);
  if (element != (Element *)0x0) {
    this_00 = (this->super_DataViewCommon).expression._M_t.
              super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>.
              _M_t.
              super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
              .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl;
    if (this_00 == (DataExpression *)0x0) {
      bVar3 = Assert("RMLUI_ASSERT(expression)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataViewDefault.cpp"
                     ,0x4f);
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      this_00 = (this->super_DataViewCommon).expression._M_t.
                super___uniq_ptr_impl<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>
                ._M_t.
                super__Tuple_impl<0UL,_Rml::DataExpression_*,_std::default_delete<Rml::DataExpression>_>
                .super__Head_base<0UL,_Rml::DataExpression_*,_false>._M_head_impl;
    }
    bVar3 = DataExpression::Run(this_00,&local_38,&local_60);
    if (bVar3) {
      local_80._M_dataplus._M_p = local_80._M_dataplus._M_p & 0xffffffffffffff00;
      Variant::GetInto<bool,_0>(&local_60,(bool *)&local_80);
      name = &(this->super_DataViewCommon).modifier;
      bVar2 = (byte)local_80._M_dataplus._M_p;
      pVVar4 = Element::GetAttribute(element,name);
      bVar5 = pVVar4 == (Variant *)0x0 ^ bVar2;
      if (bVar5 == 0) {
        if (bVar2 == 0) {
          Element::RemoveAttribute(element,name);
        }
        else {
          local_80._M_string_length = 0;
          local_80.field_2._M_local_buf[0] = '\0';
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          Element::SetAttribute<std::__cxx11::string>(element,name,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,
                            CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                                     local_80.field_2._M_local_buf[0]) + 1);
          }
        }
      }
      bVar5 = bVar5 ^ 1;
      goto LAB_0020298a;
    }
  }
  bVar5 = 0;
LAB_0020298a:
  Variant::~Variant(&local_60);
  return (bool)bVar5;
}

Assistant:

bool DataViewAttributeIf::Update(DataModel& model)
{
	const String& attribute_name = GetModifier();
	bool result = false;
	Variant variant;
	Element* element = GetElement();
	DataExpressionInterface expr_interface(&model, element);

	if (element && GetExpression().Run(expr_interface, variant))
	{
		const bool value = variant.Get<bool>();
		const bool is_set = static_cast<bool>(element->GetAttribute(attribute_name));
		if (is_set != value)
		{
			if (value)
				element->SetAttribute(attribute_name, String());
			else
				element->RemoveAttribute(attribute_name);
			result = true;
		}
	}
	return result;
}